

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O0

int cmp(void *param_1,void *param_2)

{
  undefined4 extraout_EAX;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double db;
  double da;
  double b_local;
  double a_local;
  
  dVar1 = round(in_XMM0_Qa);
  dVar2 = round(in_XMM1_Qa);
  if (1e-06 <= ABS(ABS(in_XMM0_Qa - dVar1) - ABS(in_XMM1_Qa - dVar2))) {
    a_local._7_1_ = ABS(in_XMM0_Qa - dVar1) < ABS(in_XMM1_Qa - dVar2);
  }
  else {
    a_local._7_1_ = in_XMM0_Qa < in_XMM1_Qa;
  }
  return CONCAT31((int3)((uint)extraout_EAX >> 8),a_local._7_1_);
}

Assistant:

bool cmp(double a, double b)
{
    double da = fabs((a-round(a)));
    double db = fabs((b-round(b)));
    if(fabs(da-db) < EPSILON)
    {
        return a < b;
    } else
    {
        return da < db;
    }
}